

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ONX_ModelComponentList * __thiscall
ON_ClassArray<ONX_Model::ONX_ModelComponentList>::AppendNew
          (ON_ClassArray<ONX_Model::ONX_ModelComponentList> *this)

{
  uint uVar1;
  int iVar2;
  ONX_ModelComponentList *pOVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = this->m_count;
  lVar4 = (long)(int)uVar1;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)(lVar4 * 0x18) < 0x10000001)) {
      uVar5 = 4;
      if (2 < (int)uVar1) {
        uVar5 = uVar1 * 2;
      }
    }
    else {
      uVar5 = 0xaaaab2;
      if (uVar1 < 0xaaaab2) {
        uVar5 = uVar1;
      }
      uVar5 = uVar5 + uVar1;
    }
    if (uVar1 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
  }
  else {
    pOVar3 = this->m_a;
    pOVar3[lVar4].m_component_type = Unset;
    *(undefined8 *)&pOVar3[lVar4].m_count = 0;
    *(undefined8 *)(&pOVar3[lVar4].m_count + 2) = 0;
    *(undefined4 *)((long)&pOVar3[lVar4].m_last_mcr_link + 4) = 0;
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}